

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O1

void __thiscall Win32MakefileGenerator::fixTargetExt(Win32MakefileGenerator *this)

{
  int iVar1;
  QMakeProject *pQVar2;
  long lVar3;
  Data *pDVar4;
  bool bVar5;
  ProStringList *pPVar6;
  QList<ProString> *pQVar7;
  QMovableArrayOps<ProString> *pQVar8;
  iterator iVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QStringView config;
  ProKey local_468;
  ProString local_438;
  ProKey local_408;
  ProString local_3d8;
  ProKey local_3a8;
  ProString local_378;
  ProKey local_348;
  ProString local_318;
  QStringBuilder<ProString,_ProString> local_2e8;
  QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> local_288;
  ProString local_1f8;
  ProString local_1c8;
  QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> local_198;
  char local_108;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
  local_100;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_100,"QMAKE_APP_FLAG");
  pPVar6 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_100);
  lVar3 = (pPVar6->super_QList<ProString>).d.size;
  if (&(local_100.a.a.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_100.a.a.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_100.a.a.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_100.a.a.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_100.a.a.a.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (this->super_MakefileGenerator).project;
  if (lVar3 == 0) {
    QVar10.m_data = (storage_type *)0x6;
    QVar10.m_size = (qsizetype)&local_100;
    QString::fromUtf8(QVar10);
    pDVar4 = local_100.a.a.a.a.m_string.d.d;
    config.m_data = local_100.a.a.a.a.m_string.d.ptr;
    config.m_size = local_100.a.a.a.a.m_string.d.size;
    bVar5 = QMakeEvaluator::isActiveConfig(&pQVar2->super_QMakeEvaluator,config,false);
    if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (this->super_MakefileGenerator).project;
    if (bVar5) {
      ProKey::ProKey((ProKey *)&local_1c8,"LIB_TARGET");
      pQVar8 = (QMovableArrayOps<ProString> *)
               QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_1c8);
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_348,"QMAKE_PREFIX_STATICLIB");
      QMakeEvaluator::first(&local_318,&pQVar2->super_QMakeEvaluator,&local_348);
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_3a8,"TARGET");
      QMakeEvaluator::first(&local_378,&pQVar2->super_QMakeEvaluator,&local_3a8);
      ProString::ProString(&local_2e8.a,&local_318);
      ProString::ProString(&local_2e8.b,&local_378);
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_408,"TARGET_VERSION_EXT");
      QMakeEvaluator::first(&local_3d8,&pQVar2->super_QMakeEvaluator,&local_408);
      QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                (&local_288,&local_2e8,&local_3d8);
      QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                (&local_198,&local_288);
      local_108 = '.';
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_468,"QMAKE_EXTENSION_STATICLIB");
      QMakeEvaluator::first(&local_438,&pQVar2->super_QMakeEvaluator,&local_468);
      QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)&local_100,
                 &local_198);
      local_100.a.b = local_108;
      ProString::ProString(&local_100.b,&local_438);
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,ProString>,ProString>,char>,ProString>
                (&local_1f8,&local_100);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>(pQVar8,0,&local_1f8);
      if (&(local_1f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1f8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
      ::~QStringBuilder(&local_100);
      if (&(local_438.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_438.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_438.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_438.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_438.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_468.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_468.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_468.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_468.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_468.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder(&local_198);
      QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder(&local_288);
      if (&(local_3d8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_3d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_3d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_3d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_3d8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_408.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_408.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_408.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_408.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_408.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      QStringBuilder<ProString,_ProString>::~QStringBuilder(&local_2e8);
      if (&(local_378.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_378.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_378.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_378.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_378.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_3a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_3a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_3a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if (&(local_318.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_318.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_318.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_318.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_318.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_348.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_348.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_348.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_348.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_348.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if (&(local_1c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1c8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_288,"TARGET_EXT");
      pQVar7 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_288)->
                super_QList<ProString>;
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1f8,"TARGET_VERSION_EXT");
      QMakeEvaluator::first(&local_1c8,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_1f8);
      ProString::ProString((ProString *)&local_198,&local_1c8);
      local_198.a.b.m_string.d.d = (Data *)0x2b339e;
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_348,"QMAKE_EXTENSION_SHLIB");
      QMakeEvaluator::first(&local_318,&pQVar2->super_QMakeEvaluator,&local_348);
      ProString::ProString((ProString *)&local_100,(ProString *)&local_198);
      local_100.a.a.a.b.m_string.d.d = local_198.a.b.m_string.d.d;
      ProString::ProString((ProString *)((long)&local_100.a.a.a.b.m_string + 8),&local_318);
      ProString::ProString<QStringBuilder<ProString,char_const(&)[2]>,ProString>
                (&local_2e8.a,
                 (QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
                 &local_100);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar7,(pQVar7->d).size,&local_2e8.a);
      QList<ProString>::end(pQVar7);
      if (&(local_2e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_2e8.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
                 &local_100);
      if (&(local_318.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_318.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_318.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_318.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_318.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_348.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_348.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_348.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_348.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_348.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if (&(local_198.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_198.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1c8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1f8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_288.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_288.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_288,"QMAKE_PREFIX_SHLIB");
      QMakeEvaluator::first
                ((ProString *)&local_198,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_288);
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1c8,"TARGET");
      QMakeEvaluator::first(&local_2e8.a,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_1c8);
      ProString::ProString((ProString *)&local_100,(ProString *)&local_198);
      ProString::ProString(&local_100.a.a.a.b,&local_2e8.a);
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1f8,"TARGET");
      pQVar7 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_1f8)->
                super_QList<ProString>;
      iVar9 = QList<ProString>::begin(pQVar7);
      ProString::operator=(iVar9.i,(QStringBuilder<ProString,_ProString> *)&local_100);
      if (&(local_1f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1f8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_100);
      if (&(local_2e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_2e8.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1c8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_198.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_198.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_288.a.a.m_string.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_002523d1;
      LOCK();
      ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      iVar1 = ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i;
      UNLOCK();
      local_198.a.a.m_string.d.d = local_288.a.a.m_string.d.d;
    }
    else {
      ProKey::ProKey((ProKey *)&local_198,"TARGET_EXT");
      pQVar7 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_198)->
                super_QList<ProString>;
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1c8,"QMAKE_EXTENSION_STATICLIB");
      QMakeEvaluator::first(&local_2e8.a,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_1c8);
      local_100.a.a.a.a.m_string.d.d = (Data *)0x2b339e;
      ProString::ProString((ProString *)((long)&local_100.a.a.a.a.m_string + 8),&local_2e8.a);
      ProString::ProString<char_const(&)[2],ProString>
                ((ProString *)&local_288,(QStringBuilder<const_char_(&)[2],_ProString> *)&local_100)
      ;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar7,(pQVar7->d).size,(ProString *)&local_288);
      QList<ProString>::end(pQVar7);
      if (&(local_288.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_288.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_100.a.a.a.a.m_string.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_100.a.a.a.a.m_string.d.ptr)->_q_value).super___atomic_base<int>.
        _M_i = (((QBasicAtomicInt *)local_100.a.a.a.a.m_string.d.ptr)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_100.a.a.a.a.m_string.d.ptr)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_100.a.a.a.a.m_string.d.ptr,2,0x10);
        }
      }
      if (&(local_2e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_2e8.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1c8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_198.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_198.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_288,"QMAKE_PREFIX_STATICLIB");
      QMakeEvaluator::first
                ((ProString *)&local_198,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_288);
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1c8,"TARGET");
      QMakeEvaluator::first(&local_2e8.a,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_1c8);
      ProString::ProString((ProString *)&local_100,(ProString *)&local_198);
      ProString::ProString(&local_100.a.a.a.b,&local_2e8.a);
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1f8,"TARGET");
      pQVar7 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_1f8)->
                super_QList<ProString>;
      iVar9 = QList<ProString>::begin(pQVar7);
      ProString::operator=(iVar9.i,(QStringBuilder<ProString,_ProString> *)&local_100);
      if (&(local_1f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1f8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_100);
      if (&(local_2e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_2e8.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1c8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_198.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_198.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_288.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_288.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_198,"LIB_TARGET");
      pQVar8 = (QMovableArrayOps<ProString> *)
               QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_198);
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1c8,"TARGET");
      QMakeEvaluator::first(&local_2e8.a,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_1c8);
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_318,"TARGET_EXT");
      QMakeEvaluator::first(&local_1f8,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_318);
      ProString::ProString((ProString *)&local_100,&local_2e8.a);
      ProString::ProString(&local_100.a.a.a.b,&local_1f8);
      ProString::ProString<ProString,ProString>
                ((ProString *)&local_288,(QStringBuilder<ProString,_ProString> *)&local_100);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>(pQVar8,0,(ProString *)&local_288);
      if (&(local_288.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_288.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_288.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_100);
      if (&(local_1f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1f8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_318.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_318.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_318.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_318.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_318.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_2e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_2e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_2e8.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1c8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_198.a.a.m_string.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_002523d1;
      LOCK();
      ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      iVar1 = ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i;
      UNLOCK();
    }
  }
  else {
    ProKey::ProKey((ProKey *)&local_100,"TARGET_EXT");
    pQVar7 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_100)->
              super_QList<ProString>;
    ProString::ProString((ProString *)&local_198,".exe");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar7,(pQVar7->d).size,(ProString *)&local_198);
    QList<ProString>::end(pQVar7);
    if (&(local_198.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_198.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_198.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_100.a.a.a.a.m_string.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_002523d1;
    LOCK();
    ((local_100.a.a.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_100.a.a.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_100.a.a.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i;
    UNLOCK();
    local_198.a.a.m_string.d.d = local_100.a.a.a.a.m_string.d.d;
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(&(local_198.a.a.m_string.d.d)->super_QArrayData,2,0x10);
  }
LAB_002523d1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::fixTargetExt()
{
    if (!project->values("QMAKE_APP_FLAG").isEmpty()) {
        project->values("TARGET_EXT").append(".exe");
    } else if (project->isActiveConfig("shared")) {
        project->values("LIB_TARGET").prepend(project->first("QMAKE_PREFIX_STATICLIB")
                                              + project->first("TARGET") + project->first("TARGET_VERSION_EXT")
                                              + '.' + project->first("QMAKE_EXTENSION_STATICLIB"));
        project->values("TARGET_EXT").append(project->first("TARGET_VERSION_EXT") + "."
                + project->first("QMAKE_EXTENSION_SHLIB"));
        project->values("TARGET").first() = project->first("QMAKE_PREFIX_SHLIB") + project->first("TARGET");
    } else {
        project->values("TARGET_EXT").append("." + project->first("QMAKE_EXTENSION_STATICLIB"));
        project->values("TARGET").first() = project->first("QMAKE_PREFIX_STATICLIB") + project->first("TARGET");
        project->values("LIB_TARGET").prepend(project->first("TARGET") + project->first("TARGET_EXT"));  // for the .prl only
    }
}